

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

shared_ptr<helics::Broker> helics::BrokerFactory::create(CoreType type,int argc,char **argv)

{
  int iVar1;
  undefined4 in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<helics::Broker> sVar2;
  char **in_stack_00000080;
  int in_stack_00000088;
  CoreType in_stack_0000008c;
  undefined1 in_stack_00000090 [16];
  undefined4 in_stack_ffffffffffffffc0;
  
  if (create(helics::CoreType,int,char**)::emptyString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&create(helics::CoreType,int,char**)::emptyString_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string(in_RDI);
      __cxa_atexit(std::__cxx11::string::~string,
                   &create(helics::CoreType,int,char**)::emptyString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&create(helics::CoreType,int,char**)::emptyString_abi_cxx11_);
    }
  }
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
  sVar2 = create(in_stack_0000008c,(string_view)in_stack_00000090,in_stack_00000088,
                 in_stack_00000080);
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> create(CoreType type, int argc, char* argv[])
{
    static const std::string emptyString;
    return create(type, emptyString, argc, argv);
}